

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_constraint_messages_tests.c
# Opt level: O2

Constraint * create_smaller_than_constraint(intptr_t expected_value,char *expected_value_name)

{
  Constraint *pCVar1;
  char *pcVar2;
  CgreenValueType local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  size_t local_28;
  
  pCVar1 = (Constraint *)create_constraint();
  make_cgreen_integer_value(&local_38,expected_value);
  (pCVar1->expected_value).value_size = local_28;
  (pCVar1->expected_value).type = local_38;
  *(undefined4 *)&(pCVar1->expected_value).field_0x4 = uStack_34;
  *(undefined4 *)&(pCVar1->expected_value).value = uStack_30;
  *(undefined4 *)((long)&(pCVar1->expected_value).value + 4) = uStack_2c;
  pcVar2 = (char *)string_dup(expected_value_name);
  pCVar1->expected_value_name = pcVar2;
  pCVar1->type = CGREEN_VALUE_COMPARER_CONSTRAINT;
  pCVar1->compare = compare_want_smaller_value;
  pCVar1->execute = test_want;
  pCVar1->name = "be smaller than";
  pCVar1->size_of_expected_value = 8;
  return pCVar1;
}

Assistant:

Constraint *create_smaller_than_constraint(intptr_t expected_value, const char *expected_value_name) {
    Constraint *constraint = create_constraint();

    constraint->expected_value = make_cgreen_integer_value(expected_value);
    constraint->expected_value_name = string_dup(expected_value_name);
    constraint->type = CGREEN_VALUE_COMPARER_CONSTRAINT;

    constraint->compare = &compare_want_smaller_value;
    constraint->execute = &test_want;
    constraint->name = "be smaller than";
    constraint->size_of_expected_value = sizeof(intptr_t);

    return constraint;
}